

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O0

int Abc_NtkMfsNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  float dProb_00;
  Abc_Ntk_t *pAVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t **ppAVar6;
  abctime aVar7;
  Aig_Man_t *pAVar8;
  Cnf_Dat_t *pCVar9;
  sat_solver *psVar10;
  Hop_Obj_t *pObj_00;
  abctime clk;
  int nGain;
  float dProb;
  int RetValue;
  Hop_Obj_t *pObj;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  aVar4 = Abc_Clock();
  pVVar5 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar5;
  pAVar1 = p->pNtk;
  ppAVar6 = (Abc_Obj_t **)Vec_PtrArray(p->vRoots);
  iVar2 = Vec_PtrSize(p->vRoots);
  pVVar5 = Abc_NtkNodeSupport(pAVar1,ppAVar6,iVar2);
  p->vSupp = pVVar5;
  pAVar1 = p->pNtk;
  ppAVar6 = (Abc_Obj_t **)Vec_PtrArray(p->vRoots);
  iVar2 = Vec_PtrSize(p->vRoots);
  pVVar5 = Abc_NtkDfsNodes(pAVar1,ppAVar6,iVar2);
  p->vNodes = pVVar5;
  aVar7 = Abc_Clock();
  p->timeWin = (aVar7 - aVar4) + p->timeWin;
  aVar4 = Abc_Clock();
  pAVar8 = Abc_NtkConstructAig(p,pNode);
  p->pAigWin = pAVar8;
  aVar7 = Abc_Clock();
  p->timeAig = (aVar7 - aVar4) + p->timeAig;
  aVar4 = Abc_Clock();
  pAVar8 = p->pAigWin;
  iVar2 = Abc_ObjFaninNum(pNode);
  pCVar9 = Cnf_DeriveSimple(pAVar8,iVar2);
  p->pCnf = pCVar9;
  aVar7 = Abc_Clock();
  p->timeCnf = (aVar7 - aVar4) + p->timeCnf;
  aVar4 = Abc_Clock();
  psVar10 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,1,0);
  p->pSat = psVar10;
  if ((p->pSat != (sat_solver *)0x0) && (p->pPars->fOneHotness != 0)) {
    Abc_NtkAddOneHotness(p);
  }
  if (p->pSat == (sat_solver *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = Abc_NtkMfsSolveSat(p,pNode);
    p->nTotConfLevel = p->nTotConfLevel + (int)(p->pSat->stats).conflicts;
    aVar7 = Abc_Clock();
    p->timeSat = (aVar7 - aVar4) + p->timeSat;
    if (iVar2 == 0) {
      p->nTimeOutsLevel = p->nTimeOutsLevel + 1;
      p->nTimeOuts = p->nTimeOuts + 1;
      p_local._4_4_ = 0;
    }
    else {
      iVar2 = p->nFanins;
      iVar3 = Abc_ObjFaninNum(pNode);
      if (iVar2 != iVar3) {
        __assert_fail("p->nFanins == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsCore.c"
                      ,0x160,"int Abc_NtkMfsNode(Mfs_Man_t *, Abc_Obj_t *)");
      }
      if (p->pPars->fPower == 0) {
        dProb_00 = -1.0;
      }
      else {
        dProb_00 = (float)p->vProbs->pArray[pNode->Id];
      }
      pObj_00 = Abc_NodeIfNodeResyn(p->pManDec,(Hop_Man_t *)pNode->pNtk->pManFunc,
                                    (Hop_Obj_t *)(pNode->field_5).pData,p->nFanins,p->vTruth,
                                    p->uCare,dProb_00);
      iVar3 = Hop_DagSize((Hop_Obj_t *)(pNode->field_5).pData);
      iVar2 = Hop_DagSize(pObj_00);
      iVar3 = iVar3 - iVar2;
      if (-1 < iVar3) {
        p->nNodesDec = p->nNodesDec + 1;
        p->nNodesGained = iVar3 + p->nNodesGained;
        p->nNodesGainedLevel = iVar3 + p->nNodesGainedLevel;
        (pNode->field_5).pData = pObj_00;
      }
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkMfsNode( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Hop_Obj_t * pObj;
    int RetValue;
    float dProb;
    extern Hop_Obj_t * Abc_NodeIfNodeResyn( Bdc_Man_t * p, Hop_Man_t * pHop, Hop_Obj_t * pRoot, int nVars, Vec_Int_t * vTruth, unsigned * puCare, float dProb );

    int nGain;
    abctime clk;
    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
clk = Abc_Clock();
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
p->timeWin += Abc_Clock() - clk;
    // count the number of patterns
//    p->dTotalRatios += Abc_NtkConstraintRatio( p, pNode );
    // construct AIG for the window
clk = Abc_Clock();
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
p->timeAig += Abc_Clock() - clk;
    // translate it into CNF
clk = Abc_Clock();
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, Abc_ObjFaninNum(pNode) );
p->timeCnf += Abc_Clock() - clk;
    // create the SAT problem
clk = Abc_Clock();
    p->pSat = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
    if ( p->pSat && p->pPars->fOneHotness )
        Abc_NtkAddOneHotness( p );
    if ( p->pSat == NULL )
        return 0;
    // solve the SAT problem
    RetValue = Abc_NtkMfsSolveSat( p, pNode );
    p->nTotConfLevel += p->pSat->stats.conflicts;
p->timeSat += Abc_Clock() - clk;
    if ( RetValue == 0 )
    {
        p->nTimeOutsLevel++;
        p->nTimeOuts++;
        return 0;
    }
    // minimize the local function of the node using bi-decomposition
    assert( p->nFanins == Abc_ObjFaninNum(pNode) );
    dProb = p->pPars->fPower? ((float *)p->vProbs->pArray)[pNode->Id] : -1.0;
    pObj = Abc_NodeIfNodeResyn( p->pManDec, (Hop_Man_t *)pNode->pNtk->pManFunc, (Hop_Obj_t *)pNode->pData, p->nFanins, p->vTruth, p->uCare, dProb );
    nGain = Hop_DagSize((Hop_Obj_t *)pNode->pData) - Hop_DagSize(pObj);
    if ( nGain >= 0 )
    {
        p->nNodesDec++;
        p->nNodesGained += nGain;
        p->nNodesGainedLevel += nGain;
        pNode->pData = pObj;
    }
    return 1;
}